

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O1

void nn_sinproc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint extraout_EDX;
  nn_fsm *self_00;
  
  if (self->state == 3) {
    if (src == 0x6c41) {
      if (type != 5) goto LAB_0012a1da;
LAB_0012a1f6:
      if (*(int *)&self[1].fn != 7) {
        return;
      }
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[6].owner);
      if (iVar1 != 0) {
        return;
      }
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[6].stopped.type);
      if (iVar1 != 0) {
        return;
      }
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[5].ctx);
      if (iVar1 != 0) goto LAB_0012a251;
      iVar1 = nn_fsm_event_active((nn_fsm_event *)&self[5].stopped.item);
      if (iVar1 == 0) {
        nn_fsm_stopped(self,7);
        return;
      }
      goto LAB_0012a256;
    }
    if (src == -2) {
      if (type == 5) goto LAB_0012a1f6;
      if (type != -3) goto LAB_0012a1da;
      if ((*(uint *)&self[1].fn | 4) == 5) goto LAB_0012a1ef;
      nn_pipebase_stop((nn_pipebase *)&self[1].state);
      if (0xfffffffd < self->state - 4U) {
        nn_fsm_raiseto(self,(nn_fsm *)self[1].shutdown_fn,
                       (nn_fsm_event *)&((nn_fsm *)self[1].shutdown_fn)[6].stopped.type,0x6c41,6,
                       self);
        *(undefined4 *)&self[1].fn = 6;
        goto LAB_0012a1f6;
      }
      goto LAB_0012a25b;
    }
LAB_0012a1da:
    if (*(int *)&self[1].fn != 6) goto LAB_0012a260;
    if (src == 0x6c41) {
      if (type != 6) goto LAB_0012a26e;
LAB_0012a1ef:
      *(undefined4 *)&self[1].fn = 7;
      goto LAB_0012a1f6;
    }
  }
  else {
    nn_sinproc_shutdown_cold_1();
LAB_0012a251:
    nn_sinproc_shutdown_cold_6();
LAB_0012a256:
    nn_sinproc_shutdown_cold_7();
LAB_0012a25b:
    nn_sinproc_shutdown_cold_2();
LAB_0012a260:
    nn_sinproc_shutdown_cold_3();
  }
  nn_sinproc_shutdown_cold_4();
  type = extraout_EDX;
LAB_0012a26e:
  self_00 = (nn_fsm *)(ulong)(uint)type;
  nn_sinproc_shutdown_cold_5();
  nn_list_item_term((nn_list_item *)&self_00[7].srcptr);
  nn_fsm_event_term((nn_fsm_event *)&self_00[6].stopped.type);
  nn_fsm_event_term((nn_fsm_event *)&self_00[6].owner);
  nn_fsm_event_term((nn_fsm_event *)&self_00[5].stopped.item);
  nn_fsm_event_term((nn_fsm_event *)&self_00[5].ctx);
  nn_msg_term((nn_msg *)&self_00[4].owner);
  nn_msgqueue_term((nn_msgqueue *)&self_00[3].stopped.src);
  nn_pipebase_term((nn_pipebase *)&self_00[1].state);
  nn_fsm_term(self_00);
  return;
}

Assistant:

static void nn_sinproc_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, fsm);
    nn_assert (sinproc->fsm.state == 3);

    nn_sinproc_shutdown_events (sinproc, src, type, srcptr);

    /*  ***************  */
    /*  States to check  */
    /*  ***************  */

    /*  Have we got notification that peer is stopped  */
    if (nn_slow (sinproc->state != NN_SINPROC_STATE_STOPPING)) {
        return;
    }

    /*  Are all events processed? We can't cancel them unfortunately  */
    if (nn_fsm_event_active (&sinproc->event_received)
        || nn_fsm_event_active (&sinproc->event_disconnect))
    {
        return;
    }
    /*  These events are deemed to be impossible here  */
    nn_assert (!nn_fsm_event_active (&sinproc->event_connect));
    nn_assert (!nn_fsm_event_active (&sinproc->event_sent));

    /*  **********************************************  */
    /*  All checks are successful. Just stop right now  */
    /*  **********************************************  */

    nn_fsm_stopped (&sinproc->fsm, NN_SINPROC_STOPPED);
    return;
}